

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

ChMatrix33<double> *
chrono::fea::rotutils::Elle
          (ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi,ChVector<double> *a)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ActualDstType actualDst;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  double coeff [5];
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  ChStarMatrix33<double> local_70;
  
  RotCo<chrono::ChVector<double>,double>(5,phi,phi,&local_98);
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  local_90 = -local_90;
  dVar19 = a->m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar19;
  dVar25 = a->m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar25;
  dVar16 = a->m_data[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar16;
  auVar43._0_8_ = -(dVar16 * local_90);
  auVar43._8_8_ = 0x8000000000000000;
  auVar44 = vpslldq_avx(auVar43,8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar16 * local_90;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar25 * local_90;
  auVar26 = vunpcklpd_avx(auVar35,auVar10);
  auVar50._0_8_ = -(dVar19 * local_90);
  auVar50._8_8_ = 0x8000000000000000;
  auVar51 = vpslldq_avx(auVar50,8);
  auVar36._0_8_ = -(dVar25 * local_90);
  auVar36._8_8_ = 0x8000000000000000;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar19 * local_90;
  auVar3 = vunpcklpd_avx(auVar36,auVar9);
  dVar2 = dVar25 * local_88;
  dVar17 = phi->m_data[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar17;
  dVar32 = phi->m_data[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar32;
  dVar1 = phi->m_data[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1 * dVar16 * local_88;
  auVar6 = vfnmsub231sd_fma(auVar59,auVar57,auVar54);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar16 * local_88;
  auVar4 = vmulsd_avx512f(auVar37,auVar56);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar19 * local_88;
  auVar5 = vmulsd_avx512f(auVar57,auVar52);
  auVar6 = vunpcklpd_avx512vl(auVar6,auVar5);
  auVar7 = vmulsd_avx512f(auVar52,auVar56);
  auVar7 = vfnmsub231sd_avx512f(auVar7,auVar58,auVar37);
  auVar8 = vmulsd_avx512f(auVar57,auVar37);
  auVar9 = vunpcklpd_avx512vl(auVar4,auVar8);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar19 * local_88;
  auVar8 = vmulsd_avx512f(auVar53,auVar58);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar2 * dVar17;
  auVar10 = vunpcklpd_avx512vl(auVar8,auVar60);
  auVar8 = vmulsd_avx512f(auVar54,auVar58);
  auVar7 = vunpcklpd_avx512vl(auVar7,auVar8);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar2;
  auVar11 = vmulsd_avx512f(auVar55,auVar57);
  auVar12 = vfnmsub231sd_avx512f(auVar11,auVar56,auVar53);
  auVar13 = vfmsub213sd_avx512f(auVar37,auVar57,auVar8);
  auVar4 = vfmsub213sd_avx512f(auVar53,auVar58,auVar4);
  auVar5 = vfmsub213sd_avx512f(auVar55,auVar56,auVar5);
  auVar8 = vxorpd_avx512vl(auVar5,auVar14);
  auVar61 = vpslldq_avx512vl(auVar8,8);
  auVar6 = vaddpd_avx512vl(auVar61._0_16_,auVar6);
  auVar8 = vsubpd_avx(auVar44,auVar6);
  auVar6 = vunpcklpd_avx(auVar4,auVar5);
  auVar45._0_8_ = auVar10._0_8_ + auVar6._0_8_;
  auVar45._8_8_ = auVar10._8_8_ + auVar6._8_8_;
  auVar10 = vsubpd_avx(auVar26,auVar45);
  auVar11._0_8_ = auVar13._0_8_ ^ 0x8000000000000000;
  auVar11._8_8_ = auVar13._8_8_ ^ 0x8000000000000000;
  auVar26 = vpslldq_avx(auVar11,8);
  auVar26 = vaddpd_avx512vl(auVar26,auVar7);
  auVar11 = vsubpd_avx(auVar51,auVar26);
  auVar20._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
  auVar20._8_8_ = auVar4._8_8_ ^ 0x8000000000000000;
  auVar26 = vunpcklpd_avx(auVar20,auVar13);
  auVar26 = vaddpd_avx512vl(auVar9,auVar26);
  auVar9 = vsubpd_avx(auVar3,auVar26);
  auVar14 = vaddsd_avx512f(auVar12,ZEXT816(0) << 0x40);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 * dVar25;
  auVar26 = vfmsub231sd_fma(auVar13,auVar57,auVar39);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar17 * dVar16;
  auVar3 = vfmsub231sd_fma(auVar27,auVar58,auVar18);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar32 * dVar19;
  auVar6 = vfmsub231sd_fma(auVar12,auVar56,auVar15);
  dVar17 = dVar17 * local_80;
  dVar32 = dVar32 * local_80;
  dVar1 = dVar1 * local_80;
  dVar19 = auVar26._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar19 * dVar17;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar19 * dVar32;
  auVar12 = vunpcklpd_avx(auVar40,auVar46);
  dVar25 = auVar3._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar19 * dVar1;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar17 * dVar25;
  auVar13 = vunpcklpd_avx(auVar21,auVar41);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar32 * dVar25;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 * dVar25;
  auVar15 = vunpcklpd_avx(auVar22,auVar28);
  dVar16 = auVar6._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar16 * dVar17;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar16 * dVar32;
  auVar18 = vunpcklpd_avx(auVar23,auVar29);
  ChStarMatrix33<double>::ChStarMatrix33(&local_70,phi,phi);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = a->m_data[0];
  dVar19 = a->m_data[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       dVar19 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar26 = vfmadd231sd_fma(auVar24,auVar44,auVar26);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = a->m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar26 = vfmadd231sd_fma(auVar26,auVar30,auVar3);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dVar19 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar3 = vfmadd231sd_fma(auVar33,auVar44,auVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar3 = vfmadd231sd_fma(auVar3,auVar30,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar19 * local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar6 = vfmadd231sd_fma(auVar51,auVar44,auVar5);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar4 = vfmadd231sd_fma(auVar6,auVar30,auVar7);
  dVar19 = local_78 * phi->m_data[0];
  dVar25 = local_78 * phi->m_data[1];
  local_78 = local_78 * phi->m_data[2];
  dVar17 = auVar26._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar17 * dVar19;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar17 * dVar25;
  auVar26 = vunpcklpd_avx(auVar42,auVar47);
  local_118 = auVar12._0_8_;
  dStack_110 = auVar12._8_8_;
  local_d8 = auVar8._0_8_;
  dStack_d0 = auVar8._8_8_;
  dVar32 = auVar3._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar17 * local_78;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar32 * dVar19;
  auVar3 = vunpcklpd_avx(auVar8,auVar48);
  local_108 = auVar13._0_8_;
  dStack_100 = auVar13._8_8_;
  local_c8 = auVar10._0_8_;
  dStack_c0 = auVar10._8_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar32 * local_78;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar32 * dVar25;
  auVar6 = vunpcklpd_avx(auVar49,auVar34);
  local_f8 = auVar15._0_8_;
  dStack_f0 = auVar15._8_8_;
  local_b8 = auVar11._0_8_;
  dStack_b0 = auVar11._8_8_;
  dVar17 = auVar4._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar17 * dVar19;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar17 * dVar25;
  auVar4 = vunpcklpd_avx(auVar31,auVar38);
  local_e8 = auVar18._0_8_;
  dStack_e0 = auVar18._8_8_;
  local_a8 = auVar9._0_8_;
  dStack_a0 = auVar9._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar26._0_8_ + local_118 + local_d8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar26._8_8_ + dStack_110 + dStack_d0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar3._0_8_ + local_108 + local_c8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar3._8_8_ + dStack_100 + dStack_c0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar6._0_8_ + local_f8 + local_b8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar6._8_8_ + dStack_f0 + dStack_b0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar4._0_8_ + local_e8 + local_a8;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar4._8_8_ + dStack_e0 + dStack_a0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       dVar17 * local_78 + dVar16 * dVar1 + (0.0 - auVar14._0_8_);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Elle(const ChVector<>& phi, const ChVector<>& a) {
    double coeff[COEFF_E];
    CoeffE(phi, phi, coeff);

    ChStarMatrix33<> L(a * (-coeff[1]));
    L -= ChStarMatrix33<>(phi, a * coeff[2]) + ChStarMatrix33<>(Vcross(phi, a * coeff[2]));
    L += TensorProduct(Vcross(phi, a), phi * coeff[3]) + TensorProduct(ChStarMatrix33<>(phi, phi) * a, phi * coeff[4]);

    return L;
}